

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.c
# Opt level: O1

void parse_option(state_t *state,char *parameters)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  iVar2 = strncmp(parameters,"Hash value ",0xb);
  if (iVar2 != 0) {
    return;
  }
  cVar1 = parameters[0xb];
  iVar2 = 0;
  if ((byte)(cVar1 - 0x30U) < 10) {
    pcVar4 = parameters + 0xc;
    iVar2 = 0;
    do {
      iVar2 = (uint)(byte)(cVar1 - 0x30) + iVar2 * 10;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
  }
  iVar3 = 0x400;
  if (iVar2 < 0x400) {
    iVar3 = iVar2;
  }
  iVar2 = 1;
  if (1 < iVar3) {
    iVar2 = iVar3;
  }
  ENGINE_resize_hashtable(state->engine,iVar2);
  return;
}

Assistant:

void parse_option(state_t *state, const char *parameters)
{
    if(strncmp(parameters, "Hash value ", 11) == 0) {
        parameters += 11;
        int size_mb = parse_int(parameters);
        if(size_mb < 1) size_mb = 1;
        else if(size_mb > 1024) size_mb = 1024;
        ENGINE_resize_hashtable(state->engine, size_mb);
    }
}